

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O3

void __thiscall duckdb::ART::Delete(ART *this,IndexLock *state,DataChunk *input,Vector *row_ids)

{
  Allocator *pAVar1;
  long lVar2;
  size_type __n;
  unsafe_vector<ARTKey> row_id_keys;
  unsafe_vector<ARTKey> keys;
  DataChunk expr_chunk;
  ArenaAllocator allocator;
  allocator_type local_d9;
  vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_> local_d8;
  vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_> local_c0;
  DataChunk local_a8;
  ArenaAllocator local_68;
  
  __n = input->count;
  DataChunk::DataChunk(&local_a8);
  pAVar1 = Allocator::DefaultAllocator();
  DataChunk::Initialize(&local_a8,pAVar1,&(this->super_BoundIndex).logical_types,0x800);
  BoundIndex::ExecuteExpressions(&this->super_BoundIndex,input,&local_a8);
  pAVar1 = BufferAllocator::Get((this->super_BoundIndex).super_Index.db);
  ArenaAllocator::ArenaAllocator(&local_68,pAVar1,0x800);
  ::std::vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::vector
            (&local_c0,__n,(allocator_type *)&local_d8);
  ::std::vector<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>::vector(&local_d8,__n,&local_d9);
  GenerateKeyVectors(this,&local_68,&local_a8,row_ids,(unsafe_vector<ARTKey> *)&local_c0,
                     (unsafe_vector<ARTKey> *)&local_d8);
  if (__n != 0) {
    lVar2 = 0;
    do {
      if (*(long *)((long)&(local_c0.
                            super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                            _M_impl.super__Vector_impl_data._M_start)->len + lVar2) != 0) {
        Erase(this,&this->tree,
              (ARTKey *)
              ((long)&(local_c0.super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                       _M_impl.super__Vector_impl_data._M_start)->len + lVar2),0,
              (ARTKey *)
              ((long)&(local_d8.super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                       _M_impl.super__Vector_impl_data._M_start)->len + lVar2),
              (GateStatus)((this->tree).super_IndexPointer.data >> 0x3f));
      }
      lVar2 = lVar2 + 0x10;
      __n = __n - 1;
    } while (__n != 0);
  }
  if (local_d8.super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_c0.super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c0.super__Vector_base<duckdb::ARTKey,_std::allocator<duckdb::ARTKey>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  ArenaAllocator::~ArenaAllocator(&local_68);
  DataChunk::~DataChunk(&local_a8);
  return;
}

Assistant:

void ART::Delete(IndexLock &state, DataChunk &input, Vector &row_ids) {
	// FIXME: We could pass a row_count in here, as we sometimes don't have to delete all row IDs in the chunk,
	// FIXME: but rather all row IDs up to the conflicting row.
	auto row_count = input.size();

	DataChunk expr_chunk;
	expr_chunk.Initialize(Allocator::DefaultAllocator(), logical_types);
	ExecuteExpressions(input, expr_chunk);

	ArenaAllocator allocator(BufferAllocator::Get(db));
	unsafe_vector<ARTKey> keys(row_count);
	unsafe_vector<ARTKey> row_id_keys(row_count);
	GenerateKeyVectors(allocator, expr_chunk, row_ids, keys, row_id_keys);

	for (idx_t i = 0; i < row_count; i++) {
		if (keys[i].Empty()) {
			continue;
		}
		Erase(tree, keys[i], 0, row_id_keys[i], tree.GetGateStatus());
	}

	if (!tree.HasMetadata()) {
		// No more allocations.
		VerifyAllocationsInternal();
	}

#ifdef DEBUG
	for (idx_t i = 0; i < row_count; i++) {
		if (keys[i].Empty()) {
			continue;
		}
		auto leaf = Lookup(tree, keys[i], 0);
		if (leaf && leaf->GetType() == NType::LEAF_INLINED) {
			D_ASSERT(leaf->GetRowId() != row_id_keys[i].GetRowId());
		}
	}
#endif
}